

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  int iVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int k_1;
  float val_1;
  Mat m_1;
  int q;
  float *kptr_1;
  float *outptr_1;
  int j_2;
  int i_2;
  float bias_1;
  Mat out;
  int p;
  float *weight_data_ptr;
  int g_1;
  int num_output_g;
  int channels_g;
  float w_1;
  float val;
  int k;
  float *outptr;
  int j_1;
  int i_1;
  float bias;
  Mat m;
  float *kptr;
  float *inptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 uVar5;
  int in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd4c;
  Mat *in_stack_fffffffffffffd50;
  size_type in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  float local_27c;
  int local_240;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  Mat *in_stack_fffffffffffffdd8;
  Mat *in_stack_fffffffffffffde0;
  Allocator *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int local_1fc;
  float *local_1f8;
  int local_1e4;
  int local_1e0;
  Mat local_1d8;
  int local_19c;
  float *local_198;
  int local_190;
  int local_18c;
  int local_188;
  float local_184;
  float local_180;
  int local_17c;
  float *local_178;
  int local_16c;
  int local_168;
  float local_164;
  Mat local_160;
  float *local_128;
  Mat local_120;
  float *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  reference local_c8;
  vector<int,_std::allocator<int>_> local_b8;
  int local_9c;
  undefined4 local_98;
  Mat local_88;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x28);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  if ((local_34 % *(int *)(in_RDI + 0xac) != 0) ||
     (*(int *)(in_RDI + 0x80) % *(int *)(in_RDI + 0xac) != 0)) {
    return -100;
  }
  local_44 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_48 = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  local_4c = (local_2c + -1) * *(int *)(in_RDI + 0x94) + local_44;
  local_50 = (local_30 + -1) * *(int *)(in_RDI + 0x98) + local_48;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_88);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                (int)(in_stack_fffffffffffffd58 >> 0x20),(int)in_stack_fffffffffffffd58,
                (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                (Allocator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    if (bVar2) {
      local_4 = -100;
      local_98 = 1;
      goto LAB_00155440;
    }
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                (int)(in_stack_fffffffffffffd58 >> 0x20),(int)in_stack_fffffffffffffd58,
                (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                (Allocator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    if (bVar2) {
      local_4 = -100;
      local_98 = 1;
      goto LAB_00155440;
    }
  }
  local_9c = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
  std::allocator<int>::allocator((allocator<int> *)0x1549e1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,(allocator_type *)in_stack_fffffffffffffd50);
  std::allocator<int>::~allocator((allocator<int> *)0x154a07);
  local_c8 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,0);
  local_cc = 0;
  local_d0 = 0;
  local_d4 = local_4c * *(int *)(in_RDI + 0x90) - *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
  for (local_d8 = 0; local_d8 < *(int *)(in_RDI + 0x88); local_d8 = local_d8 + 1) {
    for (local_dc = 0; local_dc < *(int *)(in_RDI + 0x84); local_dc = local_dc + 1) {
      local_c8[local_cc] = local_d0;
      local_cc = local_cc + 1;
      local_d0 = *(int *)(in_RDI + 0x8c) + local_d0;
    }
    local_d0 = local_d4 + local_d0;
  }
  if ((local_34 == *(int *)(in_RDI + 0xac)) && (*(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0x80)))
  {
    for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0xac); local_e0 = local_e0 + 1) {
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   in_stack_fffffffffffffd44);
      pfVar3 = Mat::operator_cast_to_float_(&local_120);
      Mat::~Mat((Mat *)0x154bf3);
      local_e8 = pfVar3;
      local_128 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb0));
      local_128 = local_128 + local_9c * local_e0;
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   in_stack_fffffffffffffd44);
      if (*(int *)(in_RDI + 0xa4) == 0) {
        local_27c = 0.0;
      }
      else {
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0xe8),local_e0);
        local_27c = *pfVar3;
      }
      local_164 = local_27c;
      Mat::fill(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      for (local_168 = 0; local_168 < local_30; local_168 = local_168 + 1) {
        for (local_16c = 0; local_16c < local_2c; local_16c = local_16c + 1) {
          local_178 = Mat::row(&local_160,local_168 * *(int *)(in_RDI + 0x98));
          local_178 = local_178 + local_16c * *(int *)(in_RDI + 0x94);
          for (local_17c = 0; local_17c < local_9c; local_17c = local_17c + 1) {
            local_180 = local_e8[local_168 * local_2c + local_16c];
            local_184 = local_128[local_17c];
            local_178[local_c8[local_17c]] = local_180 * local_184 + local_178[local_c8[local_17c]];
          }
        }
      }
      Mat::~Mat((Mat *)0x154ec7);
    }
  }
  else {
    local_188 = local_34 / *(int *)(in_RDI + 0xac);
    local_18c = *(int *)(in_RDI + 0x80) / *(int *)(in_RDI + 0xac);
    for (local_190 = 0; local_190 < *(int *)(in_RDI + 0xac); local_190 = local_190 + 1) {
      local_198 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb0));
      local_198 = local_198 + local_9c * local_188 * local_18c * local_190;
      for (local_19c = 0; local_19c < local_18c; local_19c = local_19c + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                     in_stack_fffffffffffffd44);
        if (*(int *)(in_RDI + 0xa4) != 0) {
          Mat::operator[]((Mat *)(in_RDI + 0xe8),local_190 * local_18c + local_19c);
        }
        Mat::fill(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        for (local_1e0 = 0; local_1e0 < local_30; local_1e0 = local_1e0 + 1) {
          for (local_1e4 = 0; local_1e4 < local_2c; local_1e4 = local_1e4 + 1) {
            pfVar3 = Mat::row(&local_1d8,local_1e0 * *(int *)(in_RDI + 0x98));
            iVar4 = local_1e4 * *(int *)(in_RDI + 0x94);
            local_1f8 = local_198 + local_9c * local_188 * local_19c;
            for (local_1fc = 0; local_1fc < local_188; local_1fc = local_1fc + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                           in_stack_fffffffffffffd44);
              in_stack_fffffffffffffd50 = (Mat *)Mat::row((Mat *)&stack0xfffffffffffffdc8,local_1e0)
              ;
              fVar1 = *(float *)((long)&in_stack_fffffffffffffd50->data + (long)local_1e4 * 4);
              for (local_240 = 0; local_240 < local_9c; local_240 = local_240 + 1) {
                pfVar3[(long)iVar4 + (long)local_c8[local_240]] =
                     fVar1 * local_1f8[local_240] + pfVar3[(long)iVar4 + (long)local_c8[local_240]];
              }
              local_1f8 = local_1f8 + local_9c;
              Mat::~Mat((Mat *)0x155294);
            }
          }
        }
        Mat::~Mat((Mat *)0x1552e7);
      }
    }
  }
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
LAB_0015540c:
    local_4 = 0;
  }
  else {
    uVar5 = *(undefined4 *)(local_28 + 4);
    copy_cut_border(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                    in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                    in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd44,uVar5));
    if (!bVar2) {
      local_4c = *(int *)(local_20 + 0x24);
      local_50 = *(int *)(local_20 + 0x28);
      goto LAB_0015540c;
    }
    local_4 = -100;
  }
  local_98 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
LAB_00155440:
  Mat::~Mat((Mat *)0x15544d);
  return local_4;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}